

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::setStatus(SPxBasisBase<double> *this,SPxStatus stat)

{
  SPxStatus in_ESI;
  SPxBasisBase<double> *in_RDI;
  int local_14;
  SPxStatus local_10;
  SPxStatus local_c [3];
  
  if (in_RDI->thestatus != in_ESI) {
    local_10 = in_RDI->thestatus;
    local_c[0] = in_ESI;
    SPxOut::
    debug<soplex::SPxBasisBase<double>,_const_char_(&)[67],_int,_soplex::SPxBasisBase<double>::SPxStatus_&,_int,_soplex::SPxBasisBase<double>::SPxStatus_&,_0>
              (in_RDI,(char (*) [67])
                      "DBSTAT01 SPxBasisBase<R>::setStatus(): status: {} ({}) -> {} ({})\n",
               &local_10,&in_RDI->thestatus,&local_14,local_c);
    in_RDI->thestatus = local_c[0];
    if (local_c[0] == NO_PROBLEM) {
      invalidate(in_RDI);
    }
  }
  return;
}

Assistant:

void setStatus(SPxStatus stat)
   {

      if(thestatus != stat)
      {
         SPxOut::debug(this, "DBSTAT01 SPxBasisBase<R>::setStatus(): status: {} ({}) -> {} ({})\n",
                       int(thestatus), thestatus, int(stat), stat);

         thestatus = stat;

         if(stat == NO_PROBLEM)
            invalidate();
      }
   }